

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void OpenSteer::draw2dTextAt3dLocation(char *text,Vec3 *location,Color *color,float w,float h)

{
  PFNGLCOLOR3FPROC p_Var1;
  GLint originalMatrixMode;
  int in_ECX;
  char *p;
  char *in_R8;
  int in_R9D;
  int iVar2;
  GLfloat extraout_XMM0_Da;
  float fVar3;
  float fVar4;
  GLint rasterPosition [4];
  int in_stack_ffffffffffffffb8;
  GLint local_38;
  int local_34;
  
  p_Var1 = glad_glColor3f;
  Color::r(color,location,color,in_ECX,in_R8,in_R9D,in_stack_ffffffffffffffb8);
  fVar3 = Color::g(color);
  fVar4 = Color::b(color);
  (*p_Var1)(extraout_XMM0_Da,fVar3,fVar4);
  (*glad_glRasterPos3f)(location->x,location->y,location->z);
  (*glad_glGetIntegerv)(0xb07,&local_38);
  originalMatrixMode = anon_unknown.dwarf_1ac78::begin2dDrawing(w,h);
  iVar2 = 0;
  do {
    if (*text == '\n') {
      iVar2 = iVar2 + 1;
      (*glad_glRasterPos2i)(local_38,local_34 + iVar2 * -0x10);
    }
    else if (*text == '\0') {
      anon_unknown.dwarf_1ac78::end2dDrawing(originalMatrixMode);
      return;
    }
    text = text + 1;
  } while( true );
}

Assistant:

void 
OpenSteer::draw2dTextAt3dLocation (const char& text,
                                   const Vec3& location,
                                   const Color& color, float w, float h)
{
    // XXX NOTE: "it would be nice if" this had a 2d screenspace offset for
    // the origin of the text relative to the screen space projection of
    // the 3d point.

    // set text color and raster position
    glColor3f (color.r(), color.g(), color.b());
    glRasterPos3f (location.x, location.y, location.z);

    // switch into 2d screen space in case we need to handle a new-line
    GLint rasterPosition[4];
    glGetIntegerv (GL_CURRENT_RASTER_POSITION, rasterPosition);
    const GLint originalMatrixMode = begin2dDrawing (w, h);

    //xxx uncommenting this causes the "2d" version to print the wrong thing
    //xxx with it out the first line of a multi-line "3d" string jiggles
    //glRasterPos2i (rasterPosition[0], rasterPosition[1]);

    // loop over each character in string (until null terminator)
    int lines = 0;
    for (const char* p = &text; *p; p++)
    {
        if (*p == '\n')
        {
            // handle new-line character, reset raster position
            lines++;
            const int fontHeight = 15; // for GLUT_BITMAP_9_BY_15
            const int vOffset = lines * (fontHeight + 1);
            glRasterPos2i (rasterPosition[0], rasterPosition[1] - vOffset);
        }
        else
        {
            // otherwise draw character bitmap
            #ifndef HAVE_NO_GLUT
                //glutBitmapCharacter (GLUT_BITMAP_9_BY_15, *p);
            #else
                // no character drawing with GLUT presently
            #endif
        }
    }

    // switch back out of 2d screen space
    end2dDrawing (originalMatrixMode);
}